

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Vat * __thiscall
capnp::_::anon_unknown_0::TestContext::initVat<capnproto_test::capnp::test::TestInterface::Client>
          (TestContext *this,StringPtr name,Client *bootstrap)

{
  _func_int *p_Var1;
  ClientHook *pCVar2;
  TestVat *network;
  Vat *pVVar3;
  Entry *pEVar4;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar5;
  Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> local_50;
  Client local_40;
  
  network = TestNetwork::add(&this->network,name);
  pVVar3 = (Vat *)operator_new(0x18);
  p_Var1 = (_func_int *)((long)&bootstrap->_vptr_Client + (long)bootstrap->_vptr_Client[-3]);
  local_40.hook.disposer = *(Disposer **)p_Var1;
  local_40.hook.ptr = *(ClientHook **)(p_Var1 + 8);
  *(undefined8 *)(&bootstrap->field_0x8 + (long)bootstrap->_vptr_Client[-3]) = 0;
  pVVar3->vatNetwork = network;
  RVar5 = makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
                    ((capnp *)&pVVar3->rpcSystem,&network->super_TestVatBase,&local_40);
  pCVar2 = local_40.hook.ptr;
  if (local_40.hook.ptr != (ClientHook *)0x0) {
    local_40.hook.ptr = (ClientHook *)0x0;
    (**(local_40.hook.disposer)->_vptr_Disposer)
              (local_40.hook.disposer,
               (_func_int *)((long)&pCVar2->_vptr_ClientHook + (long)pCVar2->_vptr_ClientHook[-2]),
               RVar5.super_RpcSystemBase.impl.ptr);
  }
  local_50.disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestContext::Vat>::instance
  ;
  local_50.ptr = pVVar3;
  pEVar4 = kj::
           HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
           ::insert(&this->vats,name,&local_50);
  pVVar3 = (pEVar4->value).ptr;
  if (local_50.ptr != (Vat *)0x0) {
    local_50.ptr = (Vat *)0x0;
    (**(local_50.disposer)->_vptr_Disposer)();
  }
  return pVVar3;
}

Assistant:

Vat& initVat(kj::StringPtr name, T bootstrap) {
    // Create a vat with the given name and bootstrap capability.
    return *vats.insert(name, kj::heap<Vat>(network.add(name), kj::mv(bootstrap))).value;
  }